

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

uint luaS_hashlongstr(TString *ts)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (ts->extra == '\0') {
    uVar2 = (ts->u).lnglen;
    uVar1 = ts->hash ^ (uint)uVar2;
    if (uVar2 != 0) {
      uVar3 = uVar2 >> 5;
      do {
        uVar1 = uVar1 ^ (uint)*(byte *)((long)&ts->u + uVar2 + 7) + (uVar1 >> 2) + uVar1 * 0x20;
        uVar2 = uVar2 + ~uVar3;
      } while (uVar3 < uVar2);
    }
    ts->hash = uVar1;
    ts->extra = '\x01';
  }
  return ts->hash;
}

Assistant:

unsigned int luaS_hashlongstr (TString *ts) {
  lua_assert(ts->tt == LUA_TLNGSTR);
  if (ts->extra == 0) {  /* no hash? */
    ts->hash = luaS_hash(getstr(ts), ts->u.lnglen, ts->hash);
    ts->extra = 1;  /* now it has its hash */
  }
  return ts->hash;
}